

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O2

void __thiscall
absl::lts_20240722::Cord::AppendImpl<absl::lts_20240722::Cord_const&>(Cord *this,Cord *src)

{
  bool bVar1;
  size_t sVar2;
  Nullable<absl::cord_internal::CordRep_*> this_00;
  CordRepFlat *pCVar3;
  Nonnull<CordRep_*> pCVar4;
  CordRep *pCVar5;
  uint8_t *puVar6;
  string_view src_00;
  reference src_01;
  ChunkIterator __begin0;
  
  InlineRep::MaybeRemoveEmptyCrcNode(&this->contents_);
  bVar1 = empty(src);
  if (!bVar1) {
    bVar1 = empty(this);
    if (!bVar1) {
      sVar2 = InlineRep::size(&src->contents_);
      if (0x1ff < sVar2) {
        pCVar4 = TakeRep(src);
        pCVar5 = cord_internal::RemoveCrcNode(pCVar4);
        InlineRep::AppendTree(&this->contents_,pCVar5,kAppendCord);
        return;
      }
      this_00 = InlineRep::tree(&src->contents_);
      if (this_00 == (Nullable<absl::cord_internal::CordRep_*>)0x0) {
        puVar6 = (uint8_t *)InlineRep::data(&src->contents_);
      }
      else {
        if (this_00->tag < 6) {
          if (src != this) {
            ChunkIterator::ChunkIterator(&__begin0,src);
            while (__begin0.bytes_remaining_ != 0) {
              src_01 = ChunkIterator::operator*(&__begin0);
              Append(this,src_01);
              ChunkIterator::operator++(&__begin0);
            }
            return;
          }
          InlineRep::InlineRep((InlineRep *)&__begin0,&src->contents_);
          AppendImpl<absl::lts_20240722::Cord>(this,(Cord *)&__begin0);
          ~Cord((Cord *)&__begin0);
          return;
        }
        pCVar3 = cord_internal::CordRep::flat(this_00);
        puVar6 = (pCVar3->super_CordRep).storage;
      }
      src_00._M_str = (char *)puVar6;
      src_00._M_len = sVar2;
      InlineRep::AppendArray(&this->contents_,src_00,kAppendCord);
      return;
    }
    if (((src->contents_).data_.rep_.field_0.data[0] & 1U) != 0) {
      pCVar4 = TakeRep(src);
      pCVar5 = cord_internal::RemoveCrcNode(pCVar4);
      InlineRep::EmplaceTree(&this->contents_,pCVar5,kAppendCord);
      return;
    }
    pCVar5 = (src->contents_).data_.rep_.field_0.as_tree.rep;
    (this->contents_).data_.rep_.field_0.as_tree.cordz_info =
         (src->contents_).data_.rep_.field_0.as_tree.cordz_info;
    (this->contents_).data_.rep_.field_0.as_tree.rep = pCVar5;
  }
  return;
}

Assistant:

inline void Cord::AppendImpl(C&& src) {
  auto constexpr method = CordzUpdateTracker::kAppendCord;

  contents_.MaybeRemoveEmptyCrcNode();
  if (src.empty()) return;

  if (empty()) {
    // Since destination is empty, we can avoid allocating a node,
    if (src.contents_.is_tree()) {
      // by taking the tree directly
      CordRep* rep =
          cord_internal::RemoveCrcNode(std::forward<C>(src).TakeRep());
      contents_.EmplaceTree(rep, method);
    } else {
      // or copying over inline data
      contents_.data_ = src.contents_.data_;
    }
    return;
  }

  // For short cords, it is faster to copy data if there is room in dst.
  const size_t src_size = src.contents_.size();
  if (src_size <= kMaxBytesToCopy) {
    CordRep* src_tree = src.contents_.tree();
    if (src_tree == nullptr) {
      // src has embedded data.
      contents_.AppendArray({src.contents_.data(), src_size}, method);
      return;
    }
    if (src_tree->IsFlat()) {
      // src tree just has one flat node.
      contents_.AppendArray({src_tree->flat()->Data(), src_size}, method);
      return;
    }
    if (&src == this) {
      // ChunkIterator below assumes that src is not modified during traversal.
      Append(Cord(src));
      return;
    }
    // TODO(mec): Should we only do this if "dst" has space?
    for (absl::string_view chunk : src.Chunks()) {
      Append(chunk);
    }
    return;
  }

  // Guaranteed to be a tree (kMaxBytesToCopy > kInlinedSize)
  CordRep* rep = cord_internal::RemoveCrcNode(std::forward<C>(src).TakeRep());
  contents_.AppendTree(rep, CordzUpdateTracker::kAppendCord);
}